

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void * Abc_FrameGiaOutputMiniAig(Abc_Frame_t *pAbc)

{
  Gia_Man_t *pGia_00;
  Mini_Aig_t *pMVar1;
  Gia_Man_t *pGia;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  pGia_00 = Abc_FrameReadGia(pAbc);
  if (pGia_00 == (Gia_Man_t *)0x0) {
    printf("Current network in ABC framework is not defined.\n");
  }
  pMVar1 = Gia_ManToMiniAig(pGia_00);
  return pMVar1;
}

Assistant:

void * Abc_FrameGiaOutputMiniAig( Abc_Frame_t * pAbc )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    return Gia_ManToMiniAig( pGia );
}